

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

void __thiscall bidfx_public_api::tools::ByteBuffer::Compact(ByteBuffer *this)

{
  ulong local_20;
  size_t i;
  int count;
  ByteBuffer *this_local;
  
  i._4_4_ = 0;
  for (local_20 = this->reader_index_; local_20 < this->writer_index_; local_20 = local_20 + 1) {
    this->buf_[i._4_4_] = this->buf_[local_20];
    i._4_4_ = i._4_4_ + 1;
  }
  this->writer_index_ = this->writer_index_ - this->reader_index_;
  this->reader_index_ = 0;
  return;
}

Assistant:

void ByteBuffer::Compact()
{
    int count = 0;
    for (size_t i = reader_index_; i < writer_index_; i++)
    {
        buf_[count] = buf_[i];
        count++;
    }
    writer_index_ -= reader_index_;
    reader_index_ = 0;
}